

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * make_METAL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  RegisterType RVar1;
  uint uVar2;
  MOJOSHADER_shaderType shader_type;
  uint uVar3;
  VariableList *pVVar4;
  undefined1 auVar5 [4];
  int iVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  char *__s;
  char *pcVar10;
  uint uVar11;
  char *__s_00;
  char local_d8 [64];
  char acStack_98 [8];
  char rel_offset [32];
  char swiz_str [6];
  undefined1 local_44 [4];
  char *pcStack_40;
  char rel_swizzle [4];
  char *local_38;
  
  pcVar7 = acStack_98;
  __s = acStack_98;
  *buf = '\0';
  switch(ctx->source_args[idx].src_mod) {
  case SRCMOD_NEGATE:
    local_38 = "-";
    goto LAB_0011f14a;
  case SRCMOD_BIAS:
    local_38 = "(";
    goto LAB_0011f193;
  case SRCMOD_BIASNEGATE:
    local_38 = "-(";
LAB_0011f193:
    pcStack_40 = " - 0.5)";
    goto LAB_0011f1e7;
  case SRCMOD_SIGN:
    local_38 = "((";
    goto LAB_0011f176;
  case SRCMOD_SIGNNEGATE:
    local_38 = "-((";
LAB_0011f176:
    pcStack_40 = " - 0.5) * 2.0)";
    goto LAB_0011f1e7;
  case SRCMOD_COMPLEMENT:
    local_38 = "(1.0 - ";
    break;
  case SRCMOD_X2:
    local_38 = "(";
    goto LAB_0011f1ba;
  case SRCMOD_X2NEGATE:
    local_38 = "-(";
LAB_0011f1ba:
    pcStack_40 = " * 2.0)";
    goto LAB_0011f1e7;
  case SRCMOD_DZ:
    pcVar9 = "SRCMOD_DZ unsupported";
    goto LAB_0011f47d;
  case SRCMOD_DW:
    pcVar9 = "SRCMOD_DW unsupported";
    pcVar7 = acStack_98;
    goto LAB_0011f47d;
  case SRCMOD_ABS:
    ctx->metal_need_header_math = 1;
    local_38 = "abs(";
    break;
  case SRCMOD_ABSNEGATE:
    ctx->metal_need_header_math = 1;
    local_38 = "-abs(";
    break;
  case SRCMOD_NOT:
    local_38 = "!";
LAB_0011f14a:
    pcStack_40 = "";
    goto LAB_0011f1e7;
  default:
    pcStack_40 = "";
    local_38 = "";
    goto LAB_0011f1e7;
  }
  pcStack_40 = ")";
LAB_0011f1e7:
  if (ctx->source_args[idx].relative == 0) {
    __s = local_d8;
    pcVar7 = acStack_98;
    pcVar9 = get_D3D_register_string
                       (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,pcVar7,buflen
                       );
    snprintf(__s,0x40,"%s%s",pcVar9);
    pcVar9 = __s;
  }
  else {
    pcVar7 = (char *)buflen;
    pcVar9 = (char *)0x0;
  }
  rel_offset[8] = '\0';
  rel_offset[9] = '\0';
  rel_offset[10] = '\0';
  rel_offset[0xb] = '\0';
  rel_offset[0xc] = '\0';
  rel_offset[0xd] = '\0';
  rel_offset[0xe] = '\0';
  rel_offset[0xf] = '\0';
  rel_offset[0x10] = '\0';
  rel_offset[0x11] = '\0';
  rel_offset[0x12] = '\0';
  rel_offset[0x13] = '\0';
  rel_offset[0x14] = '\0';
  rel_offset[0x15] = '\0';
  rel_offset[0x16] = '\0';
  rel_offset[0x17] = '\0';
  acStack_98[0] = '\0';
  acStack_98[1] = '\0';
  acStack_98[2] = '\0';
  acStack_98[3] = '\0';
  acStack_98[4] = '\0';
  acStack_98[5] = '\0';
  acStack_98[6] = '\0';
  acStack_98[7] = '\0';
  rel_offset[0] = '\0';
  rel_offset[1] = '\0';
  rel_offset[2] = '\0';
  rel_offset[3] = '\0';
  rel_offset[4] = '\0';
  rel_offset[5] = '\0';
  rel_offset[6] = '\0';
  rel_offset[7] = '\0';
  local_44 = (undefined1  [4])0x0;
  if (ctx->source_args[idx].relative == 0) {
    pcVar7 = "";
    pcVar10 = "";
    __s_00 = "";
  }
  else {
    RVar1 = ctx->source_args[idx].regtype;
    if (RVar1 == REG_TYPE_CONST) {
      pVVar4 = ctx->source_args[idx].relative_array;
      uVar3 = pVVar4->index;
      uVar2 = ctx->source_args[idx].regnum;
      uVar11 = uVar2 - uVar3;
      if ((int)uVar11 < 0) {
        *(code **)(__s + -8) = make_METAL_swizzle_string;
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1128,
                      "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      if (pVVar4->constant == (ConstantsList *)0x0) {
        __s[-0x48] = '5';
        __s[-0x47] = -0xd;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(__s + -0x40,0x40,"uniforms.uniforms_%s","float4");
        if (uVar2 == uVar3) {
          pcVar9 = "ARRAYBASE_%d + ";
          goto LAB_0011f350;
        }
        pcVar7 = (char *)(ulong)uVar11;
        __s[-0x48] = -0x74;
        __s[-0x47] = -0xd;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(acStack_98,0x20,"(ARRAYBASE_%d + %d) + ",(ulong)uVar3);
      }
      else {
        pcVar7 = (char *)(ulong)(uint)pVVar4->count;
        __s[-0x48] = -0x13;
        __s[-0x47] = -0xe;
        __s[-0x46] = '\x11';
        __s[-0x45] = '\0';
        __s[-0x44] = '\0';
        __s[-0x43] = '\0';
        __s[-0x42] = '\0';
        __s[-0x41] = '\0';
        snprintf(__s + -0x40,0x40,"const_array_%d_%d",(ulong)uVar3);
        if (uVar2 != uVar3) {
          pcVar9 = "%d + ";
          uVar3 = uVar11;
LAB_0011f350:
          __s[-0x48] = 'W';
          __s[-0x47] = -0xd;
          __s[-0x46] = '\x11';
          __s[-0x45] = '\0';
          __s[-0x44] = '\0';
          __s[-0x43] = '\0';
          __s[-0x42] = '\0';
          __s[-0x41] = '\0';
          snprintf(acStack_98,0x20,pcVar9,(ulong)uVar3);
        }
      }
    }
    else {
      if (RVar1 != REG_TYPE_INPUT) {
        __s[-8] = -0x4a;
        __s[-7] = -0xc;
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1125,
                      "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      builtin_strncpy(__s + -0x40,"vertex_input_array",0x13);
    }
    pcVar9 = __s + -0x40;
    RVar1 = ctx->source_args[idx].relative_regtype;
    iVar8 = ctx->source_args[idx].relative_regnum;
    __s_00 = __s + -0x80;
    __s[-0x88] = -0x54;
    __s[-0x87] = -0xd;
    __s[-0x86] = '\x11';
    __s[-0x85] = '\0';
    __s[-0x84] = '\0';
    __s[-0x83] = '\0';
    __s[-0x82] = '\0';
    __s[-0x81] = '\0';
    pcVar7 = get_D3D_register_string(ctx,RVar1,iVar8,rel_offset + 0x18,(size_t)pcVar7);
    __s[-0x88] = -0x38;
    __s[-0x87] = -0xd;
    __s[-0x86] = '\x11';
    __s[-0x85] = '\0';
    __s[-0x84] = '\0';
    __s[-0x83] = '\0';
    __s[-0x82] = '\0';
    __s[-0x81] = '\0';
    snprintf(__s_00,0x40,"%s%s",pcVar7,rel_offset + 0x18);
    auVar5 = local_44;
    local_44[1] = "xyzw"[ctx->source_args[idx].relative_component];
    local_44[0] = 0x2e;
    local_44[3] = auVar5[3];
    local_44[2] = 0;
    pcVar10 = "]";
    pcVar7 = "[";
    __s = __s_00;
  }
  rel_offset[0x1c] = '\0';
  rel_offset[0x1d] = '\0';
  rel_offset[0x18] = '\0';
  rel_offset[0x19] = '\0';
  rel_offset[0x1a] = '\0';
  rel_offset[0x1b] = '\0';
  shader_type = ctx->shader_type;
  iVar8 = ctx->source_args[idx].regnum;
  RVar1 = ctx->source_args[idx].regtype;
  __s[-8] = '\x11';
  __s[-7] = -0xc;
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar6 = isscalar(ctx,shader_type,RVar1,iVar8);
  if (iVar6 == 0) {
    uVar3 = ctx->source_args[idx].swizzle;
    __s[-8] = '$';
    __s[-7] = -0xc;
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    make_METAL_swizzle_string(rel_offset + 0x18,(ulong)uVar3,writemask,iVar8);
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "Unknown source register type.";
    pcVar7 = __s;
LAB_0011f47d:
    *(undefined8 *)(pcVar7 + -8) = 0x11f484;
    failf(ctx,"%s",pcVar9);
  }
  else {
    *(char **)(__s + -8) = pcStack_40;
    *(char **)(__s + -0x10) = rel_offset + 0x18;
    *(char **)(__s + -0x18) = pcVar10;
    *(undefined1 **)(__s + -0x20) = local_44;
    *(char **)(__s + -0x28) = __s_00;
    *(char **)(__s + -0x30) = acStack_98;
    __s[-0x38] = 'e';
    __s[-0x37] = -0xc;
    __s[-0x36] = '\x11';
    __s[-0x35] = '\0';
    __s[-0x34] = '\0';
    __s[-0x33] = '\0';
    __s[-0x32] = '\0';
    __s[-0x31] = '\0';
    snprintf(buf,0x40,"%s%s%s%s%s%s%s%s%s",local_38,pcVar9,pcVar7);
  }
  return buf;
}

Assistant:

static const char *make_METAL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            ctx->metal_need_header_math = 1;
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            ctx->metal_need_header_math = 1;
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_METAL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_METAL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_METAL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_METAL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_METAL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}